

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetRootMethodNoFastPath_Var
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  DynamicObject *object;
  Var pvVar1;
  
  object = VarTo<Js::DynamicObject>(instance);
  pvVar1 = PatchGetRootMethodNoFastPath(functionBody,inlineCache,inlineCacheIndex,object,propertyId)
  ;
  return pvVar1;
}

Assistant:

Var JavascriptOperators::PatchGetRootMethodNoFastPath_Var(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        return
            PatchGetRootMethodNoFastPath(
                functionBody,
                inlineCache,
                inlineCacheIndex,
                VarTo<DynamicObject>(instance),
                propertyId);
    }